

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_fetch.hpp
# Opt level: O3

void duckdb::AlpFetchRow<double>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  AlpScanState<double> local_6890;
  
  AlpScanState<double>::AlpScanState(&local_6890,segment);
  AlpScanState<double>::Skip(&local_6890,segment,row_id);
  pdVar2 = result->data;
  pdVar1 = pdVar2 + result_idx * 8;
  pdVar1[0] = '\0';
  pdVar1[1] = '\0';
  pdVar1[2] = '\0';
  pdVar1[3] = '\0';
  pdVar1[4] = '\0';
  pdVar1[5] = '\0';
  pdVar1[6] = '\0';
  pdVar1[7] = '\0';
  if (((local_6890.total_value_count & 0x3ff) == 0) &&
     (local_6890.total_value_count < local_6890.count)) {
    AlpScanState<double>::LoadVector<false>(&local_6890,local_6890.vector_state.decoded_values);
  }
  *(double *)(pdVar2 + result_idx * 8) =
       local_6890.vector_state.decoded_values[local_6890.vector_state.index];
  local_6890.total_value_count = local_6890.total_value_count + 1;
  local_6890.vector_state.index = local_6890.vector_state.index + 1;
  local_6890.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__AlpScanState_0197a1f0;
  BufferHandle::~BufferHandle(&local_6890.handle);
  return;
}

Assistant:

void AlpFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

	AlpScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<EXACT_TYPE>(result);
	result_data[result_idx] = (EXACT_TYPE)0;

	if (scan_state.VectorFinished() && scan_state.total_value_count < scan_state.count) {
		scan_state.LoadVector(scan_state.vector_state.decoded_values);
	}
	scan_state.vector_state.Scan((uint8_t *)(result_data + result_idx), 1);
	scan_state.total_value_count++;
}